

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::UnfixString(json_string *value_t,bool flag,json_string *res)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  uchar extraout_DL;
  uchar extraout_DL_00;
  uchar extraout_DL_01;
  uchar extraout_DL_02;
  uchar extraout_DL_03;
  uchar extraout_DL_04;
  uchar extraout_DL_05;
  uchar extraout_DL_06;
  uchar extraout_DL_07;
  uchar extraout_DL_08;
  uchar extraout_DL_09;
  uchar p_00;
  json_string local_60;
  byte *local_40;
  char *p;
  char *end;
  json_string *local_20;
  json_string *res_local;
  json_string *pjStack_10;
  bool flag_local;
  json_string *value_t_local;
  
  local_20 = res;
  res_local._7_1_ = flag;
  pjStack_10 = value_t;
  if (flag) {
    lVar3 = std::__cxx11::string::data();
    lVar4 = std::__cxx11::string::length();
    p = (char *)(lVar3 + lVar4);
    local_40 = (byte *)std::__cxx11::string::data();
    p_00 = extraout_DL;
    for (; local_40 != (byte *)p; local_40 = local_40 + 1) {
      bVar1 = *local_40;
      if (bVar1 == 8) {
        std::__cxx11::string::operator+=((string *)local_20,"\\b");
        p_00 = extraout_DL_06;
      }
      else if (bVar1 == 9) {
        std::__cxx11::string::operator+=((string *)local_20,"\\t");
        p_00 = extraout_DL_02;
      }
      else if (bVar1 == 10) {
        std::__cxx11::string::operator+=((string *)local_20,"\\n");
        p_00 = extraout_DL_03;
      }
      else if (bVar1 == 0xc) {
        std::__cxx11::string::operator+=((string *)local_20,"\\f");
        p_00 = extraout_DL_07;
      }
      else if (bVar1 == 0xd) {
        std::__cxx11::string::operator+=((string *)local_20,"\\r");
        p_00 = extraout_DL_04;
      }
      else if (bVar1 == 0x22) {
        std::__cxx11::string::operator+=((string *)local_20,"\\\"");
        p_00 = extraout_DL_00;
      }
      else if (bVar1 == 0x2f) {
        std::__cxx11::string::operator+=((string *)local_20,"\\/");
        p_00 = extraout_DL_05;
      }
      else if (bVar1 == 0x5c) {
        std::__cxx11::string::operator+=((string *)local_20,"\\\\");
        p_00 = extraout_DL_01;
      }
      else {
        bVar2 = true;
        if (0x1f < *local_40) {
          bVar2 = 0x7e < *local_40;
        }
        if (bVar2) {
          toUTF8_abi_cxx11_(&local_60,(JSONWorker *)(ulong)*local_40,p_00);
          std::__cxx11::string::operator+=((string *)local_20,(string *)&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          p_00 = extraout_DL_08;
        }
        else {
          std::__cxx11::string::operator+=((string *)local_20,*local_40);
          p_00 = extraout_DL_09;
        }
      }
    }
  }
  else {
    std::__cxx11::string::operator+=((string *)res,(string *)value_t);
  }
  return;
}

Assistant:

void JSONWorker::UnfixString(const json_string & value_t, bool flag, json_string & res) json_nothrow {
    if (!flag){
		res += value_t;
		return;
	}
    //Re-escapes a json_string so that it can be written out into a JSON file
	const json_char * const end = value_t.data() + value_t.length();
    for(const json_char * p = value_t.data(); p != end; ++p){
	   switch(*p){
		  case JSON_TEXT('\"'):  //quote character
			 res += JSON_TEXT("\\\"");
			 break;
		  case JSON_TEXT('\\'):	//backslash
			 res += JSON_TEXT("\\\\");
			 break;
		  #ifdef JSON_ESCAPE_WRITES
			 case JSON_TEXT('\t'):	//tab character
				res += JSON_TEXT("\\t");
				break;
			 case JSON_TEXT('\n'):	//newline character
				res += JSON_TEXT("\\n");
				break;
			 case JSON_TEXT('\r'):	//return character
				res += JSON_TEXT("\\r");
				break;
			 case JSON_TEXT('/'):	//forward slash
				res += JSON_TEXT("\\/");
				break;
			 case JSON_TEXT('\b'):	//backspace
				res += JSON_TEXT("\\b");
				break;
			 case JSON_TEXT('\f'):	//formfeed
				res += JSON_TEXT("\\f");
				break;
			 default:
			 {
				if (json_unlikely(((json_uchar)(*p) < 32) || ((json_uchar)(*p) > 126))){
				    res += toUTF8((json_uchar)(*p));
				} else {
				    res += *p;
				}
			}
				break;
		  #else
			 default:
				res += *p;
				break;
		  #endif
	   }
    }
}